

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O3

__pid_t __thiscall CountDownLatch::wait(CountDownLatch *this,void *__stat_loc)

{
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  while (0 < this->count_) {
    pthread_cond_wait((pthread_cond_t *)&(this->condition_).cond,
                      (pthread_mutex_t *)(this->condition_).mutex);
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return iVar1;
}

Assistant:

void CountDownLatch::wait(){
    MutexLockGuard lock(mutex_);
    while (count_>0) {
        condition_.wait();
    }
}